

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RandomGraphGenerator.cpp
# Opt level: O0

bool __thiscall
ADS::RandomGraphGenerator::generate
          (RandomGraphGenerator *this,Graph<unsigned_int> *pGraph,uint uiNVerteces,uint uiDensity,
          bool bConnected,bool bPreGenerateVerticies)

{
  bool bVar1;
  uint uiNEdges_00;
  double __x;
  undefined1 local_5d;
  undefined4 local_30;
  uint uiNEdges;
  uint uiSrc;
  bool bPreGenerateVerticies_local;
  bool bConnected_local;
  uint uiDensity_local;
  uint uiNVerteces_local;
  Graph<unsigned_int> *pGraph_local;
  RandomGraphGenerator *this_local;
  
  if (pGraph == (Graph<unsigned_int> *)0x0) {
    this_local._7_1_ = false;
  }
  else {
    if (bPreGenerateVerticies) {
      for (local_30 = 0; local_30 < uiNVerteces; local_30 = local_30 + 1) {
        Graph<unsigned_int>::addVertex(pGraph,local_30);
      }
    }
    bVar1 = Graph<unsigned_int>::isDirected(pGraph);
    uiNEdges_00 = GraphUtils::getNumberOfEdges(uiNVerteces,uiDensity,bVar1);
    log(__x);
    bVar1 = addEdges(this,pGraph,uiNVerteces,uiNEdges_00);
    if (bVar1) {
      while( true ) {
        local_5d = 0;
        if (bConnected) {
          bVar1 = Graph<unsigned_int>::isConnected(pGraph,false);
          local_5d = bVar1 ^ 0xff;
        }
        if ((local_5d & 1) == 0) break;
        addEdges(this,pGraph,uiNVerteces,1);
      }
      this_local._7_1_ = true;
    }
    else {
      this_local._7_1_ = false;
    }
  }
  return this_local._7_1_;
}

Assistant:

bool RandomGraphGenerator::generate (Graph<unsigned int> *pGraph,
                                     unsigned int uiNVerteces,
                                     unsigned int uiDensity, bool bConnected,
                                     bool bPreGenerateVerticies)
{
    if (pGraph == NULL)
        return false;

    if (bPreGenerateVerticies)
        for (unsigned int uiSrc = 0; uiSrc < uiNVerteces; uiSrc++)
            pGraph->addVertex (uiSrc);

    unsigned int uiNEdges = GraphUtils::getNumberOfEdges (uiNVerteces, uiDensity,
                                                          pGraph->isDirected());
    log ("Creating graph of %u edges\n", uiNEdges);

    if (!addEdges (pGraph, uiNVerteces, uiNEdges))
        return false;

    while (bConnected && !pGraph->isConnected())
        /* add edges one-by-one until the graph is connected */
        addEdges (pGraph, uiNVerteces, 1);

    return true;
}